

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_sparse.cpp
# Opt level: O2

iterator_element * __thiscall
Disa::Matrix_Sparse::erase
          (iterator_element *__return_storage_ptr__,Matrix_Sparse *this,
          Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse> *iter_element)

{
  size_t *i_row;
  pointer puVar1;
  pointer pvVar2;
  pointer pdVar3;
  bool bVar4;
  iterator i_column;
  iterator value;
  ostream *poVar5;
  source_location *in_RCX;
  pointer puVar6;
  undefined1 auStack_b8 [32];
  undefined1 local_98 [32];
  iterator local_78;
  undefined **local_58;
  iterator local_50;
  
  end((Matrix_Sparse *)local_98);
  Matrix_Sparse_Row<Disa::Matrix_Sparse>::end
            (&local_50,(Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_98);
  bVar4 = Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>::operator!=(iter_element,&local_50);
  if (bVar4) {
    i_row = &iter_element->row_index;
    operator[]((Matrix_Sparse *)auStack_b8,(size_t *)this);
    Matrix_Sparse_Row<Disa::Matrix_Sparse>::end
              ((iterator *)(local_98 + 0x20),(Matrix_Sparse_Row<Disa::Matrix_Sparse> *)auStack_b8);
    bVar4 = Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>::operator!=
                      (iter_element,(iterator *)(local_98 + 0x20));
    if (bVar4) {
      bVar4 = contains(this,i_row,iter_element->column_index);
      if (bVar4) {
        puVar1 = (this->row_non_zero).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        puVar6 = (this->row_non_zero).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start + *i_row;
        while (puVar6 = puVar6 + 1, puVar6 < puVar1) {
          *puVar6 = *puVar6 - 1;
        }
        pvVar2 = iter_element->value;
        pdVar3 = (this->element_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        i_column = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::erase
                             (&this->column_index,
                              (unsigned_long *)
                              ((long)pvVar2 +
                              ((long)(this->column_index).
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     ._M_impl.super__Vector_impl_data._M_start - (long)pdVar3)));
        value = std::vector<double,_std::allocator<double>_>::erase
                          (&this->element_value,
                           (double *)
                           ((long)pvVar2 +
                           ((long)(this->element_value).
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_start - (long)pdVar3)));
        Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>::Iterator_Matrix_Sparse_Element
                  (__return_storage_ptr__,this,i_row,i_column._M_current,value._M_current);
        return __return_storage_ptr__;
      }
    }
  }
  poVar5 = std::operator<<((ostream *)&std::cerr,"\n");
  local_58 = &PTR_s__workspace_llm4binary_github_lic_00150d60;
  console_format_abi_cxx11_
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_50,
             (Disa *)0x0,(Log_Level)&local_58,in_RCX);
  poVar5 = std::operator<<(poVar5,(string *)&local_50);
  row_column_abi_cxx11_
            ((string *)auStack_b8,(Matrix_Sparse *)iter_element->row_index,
             *iter_element->column_index,(size_t)in_RCX);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
                 "Entry [",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_b8);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_98 + 0x20),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
                 "] does not exist.");
  poVar5 = std::operator<<(poVar5,(string *)(local_98 + 0x20));
  std::endl<char,std::char_traits<char>>(poVar5);
  std::__cxx11::string::~string((string *)(local_98 + 0x20));
  std::__cxx11::string::~string((string *)local_98);
  std::__cxx11::string::~string((string *)auStack_b8);
  std::__cxx11::string::~string((string *)&local_50);
  exit(1);
}

Assistant:

Matrix_Sparse::iterator_element Matrix_Sparse::erase(
const Iterator_Matrix_Sparse_Element<Matrix_Sparse>& iter_element) {
  ASSERT_DEBUG(iter_element != end()->end() && iter_element != (*this)[iter_element.i_row()].end() &&
               contains(iter_element.i_row(), iter_element.i_column()),
               "Entry [" + row_column(iter_element.i_row(), iter_element.i_column()) + "] does not exist.");
  for(auto non_zeros = std::next(row_non_zero.begin(), static_cast<s_size_t>(iter_element.i_row() + 1));
      non_zeros < row_non_zero.end(); --(*non_zeros++))
    ;
  const auto distance = std::distance(&*element_value.cbegin(), &*iter_element);
  return {this, iter_element.i_row(), &*(column_index.erase(column_index.begin() + distance)),
          &*(element_value.erase(element_value.begin() + distance))};
}